

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvacounter.c
# Opt level: O0

void print_difference(signal_difference diff)

{
  undefined4 in_ESI;
  ulong in_RDI;
  char *difference_s;
  char *local_28;
  undefined4 uStack_c;
  byte local_8;
  byte bStack_7;
  
  local_28 = (char *)0x0;
  uStack_c = (undefined4)(in_RDI >> 0x20);
  switch(uStack_c) {
  case 0:
    local_28 = "ONE TO ZERO";
    break;
  case 1:
    local_28 = "ZERO TO ONE";
    break;
  case 2:
    local_28 = "OTHER TO ZERO";
    break;
  case 3:
    local_28 = "OTHER TO ONE";
    break;
  case 4:
    local_28 = "ONE TO OTHER";
    break;
  case 5:
    local_28 = "ZERO TO OTHER";
    break;
  case 0xffffffff:
    local_28 = "NO CHANGE";
  }
  local_8 = (byte)in_ESI;
  bStack_7 = (byte)((uint)in_ESI >> 8);
  printf("Diff at set %i, signal 0x%.2x): %i->%i/100 (%s?)\n",in_RDI & 0xff,in_RDI >> 8 & 0xff,
         (ulong)local_8,(ulong)bStack_7,local_28);
  return;
}

Assistant:

void print_difference(struct signal_difference diff)
{
	const char *difference_s = NULL;

	switch(diff.change)
	{
	case NO_CHANGE:
		difference_s = "NO CHANGE";
		break;
	case ONE_TO_ZERO:
		difference_s = "ONE TO ZERO";
		break;
	case ZERO_TO_ONE:
		difference_s = "ZERO TO ONE";
		break;
	case OTHER_TO_ZERO:
		difference_s = "OTHER TO ZERO";
		break;
	case OTHER_TO_ONE:
		difference_s = "OTHER TO ONE";
		break;
	case ONE_TO_OTHER:
		difference_s = "ONE TO OTHER";
		break;
	case ZERO_TO_OTHER:
		difference_s = "ZERO TO OTHER";
		break;
	}
	printf("Diff at set %i, signal 0x%.2x): %i->%i/100 (%s?)\n",
			      diff.set, diff.signal, diff.count_before, diff.count_after, difference_s);
}